

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::Imputer::_InternalSerialize
          (Imputer *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  string *psVar5;
  int64_t iVar6;
  double dVar7;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (this->_oneof_case_[0] == 1) {
      dVar7 = (this->ImputedValue_).imputeddoublevalue_;
    }
    else {
      dVar7 = 0.0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray(1,dVar7,puVar2);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 2) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (this->_oneof_case_[0] == 2) {
      iVar6 = (this->ImputedValue_).imputedint64value_;
    }
    else {
      iVar6 = 0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArray(2,iVar6,puVar2);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 3) {
    puVar3 = (undefined8 *)((this->ImputedValue_).imputedint64value_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "CoreML.Specification.Imputer.imputedStringValue");
    if (this->_oneof_case_[0] == 3) {
      psVar5 = (string *)((this->ImputedValue_).imputedint64value_ & 0xfffffffffffffffe);
    }
    else {
      psVar5 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,3,psVar5,target);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 4) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::DoubleVector>
                       (4,(this->ImputedValue_).imputeddoublearray_,puVar2,stream);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 5) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::Int64Vector>
                       (5,(this->ImputedValue_).imputedint64array_,puVar2,stream);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 6) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::StringToDoubleMap>
                       (6,(this->ImputedValue_).imputedstringdictionary_,puVar2,stream);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 7) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::Int64ToDoubleMap>
                       (7,(this->ImputedValue_).imputedint64dictionary_,puVar2,stream);
  }
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0xb) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (this->_oneof_case_[1] == 0xb) {
      dVar7 = (this->ReplaceValue_).replacedoublevalue_;
    }
    else {
      dVar7 = 0.0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray(0xb,dVar7,puVar2);
    uVar1 = this->_oneof_case_[1];
  }
  if (uVar1 == 0xc) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (this->_oneof_case_[1] == 0xc) {
      iVar6 = (this->ReplaceValue_).replaceint64value_;
    }
    else {
      iVar6 = 0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArray(0xc,iVar6,puVar2);
    uVar1 = this->_oneof_case_[1];
  }
  if (uVar1 == 0xd) {
    puVar3 = (undefined8 *)((this->ReplaceValue_).replaceint64value_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "CoreML.Specification.Imputer.replaceStringValue");
    if (this->_oneof_case_[1] == 0xd) {
      psVar5 = (string *)((this->ReplaceValue_).replaceint64value_ & 0xfffffffffffffffe);
    }
    else {
      psVar5 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xd,psVar5,target);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) == 0) {
    return target;
  }
  uVar4 = uVar4 & 0xfffffffffffffffc;
  puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),target);
  return puVar2;
}

Assistant:

uint8_t* Imputer::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Imputer)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double imputedDoubleValue = 1;
  if (_internal_has_imputeddoublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(1, this->_internal_imputeddoublevalue(), target);
  }

  // int64 imputedInt64Value = 2;
  if (_internal_has_imputedint64value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(2, this->_internal_imputedint64value(), target);
  }

  // string imputedStringValue = 3;
  if (_internal_has_imputedstringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_imputedstringvalue().data(), static_cast<int>(this->_internal_imputedstringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.imputedStringValue");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_imputedstringvalue(), target);
  }

  // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
  if (_internal_has_imputeddoublearray()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::imputeddoublearray(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
  if (_internal_has_imputedint64array()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::imputedint64array(this), target, stream);
  }

  // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
  if (_internal_has_imputedstringdictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        6, _Internal::imputedstringdictionary(this), target, stream);
  }

  // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
  if (_internal_has_imputedint64dictionary()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::imputedint64dictionary(this), target, stream);
  }

  // double replaceDoubleValue = 11;
  if (_internal_has_replacedoublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(11, this->_internal_replacedoublevalue(), target);
  }

  // int64 replaceInt64Value = 12;
  if (_internal_has_replaceint64value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(12, this->_internal_replaceint64value(), target);
  }

  // string replaceStringValue = 13;
  if (_internal_has_replacestringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_replacestringvalue().data(), static_cast<int>(this->_internal_replacestringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Imputer.replaceStringValue");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_replacestringvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Imputer)
  return target;
}